

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasIOS16Features(Model *model)

{
  bool bVar1;
  undefined1 local_14;
  undefined1 local_13;
  bool result;
  Model *model_local;
  
  bVar1 = hasFloat16MultiArray(model);
  local_13 = true;
  if (!bVar1) {
    local_13 = hasGrayscaleFloat16Image(model);
  }
  local_14 = true;
  if (local_13 == false) {
    local_14 = hasCoreML6Opsets(model);
  }
  return local_14;
}

Assistant:

bool CoreML::hasIOS16Features(const Specification::Model& model) {
    // New in IOS16 features:
    //  - FLOAT16 array data type
    //  - GRAYSCALE_FLOAT16 image color space.
    //  - CoreML6 Opsets for mlProgram models
    
    bool result = false;
    result = result || hasFloat16MultiArray(model);
    result = result || hasGrayscaleFloat16Image(model);
    result = result || hasCoreML6Opsets(model);

    return result;
}